

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::PrivateToLocalPass::UpdateUses(PrivateToLocalPass *this,Instruction *inst)

{
  pointer ppIVar1;
  pointer ppIVar2;
  bool bVar3;
  uint32_t id;
  DefUseManager *this_00;
  pointer ppIVar4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  id = Instruction::result_id(inst);
  uses.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uses.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uses.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/private_to_local_pass.cpp:225:11)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/private_to_local_pass.cpp:225:11)>
             ::_M_manager;
  local_48._M_unused._M_object = &uses;
  analysis::DefUseManager::ForEachUser
            (this_00,id,(function<void_(spvtools::opt::Instruction_*)> *)&local_48);
  ppIVar2 = uses.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = uses.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
    ppIVar2 = uses.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar1 = uses.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  do {
    ppIVar4 = ppIVar2;
    if (ppIVar4 == ppIVar1) break;
    bVar3 = UpdateUse(this,*ppIVar4,inst);
    ppIVar2 = ppIVar4 + 1;
  } while (bVar3);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&uses.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return ppIVar4 == ppIVar1;
}

Assistant:

bool PrivateToLocalPass::UpdateUses(Instruction* inst) {
  uint32_t id = inst->result_id();
  std::vector<Instruction*> uses;
  context()->get_def_use_mgr()->ForEachUser(
      id, [&uses](Instruction* use) { uses.push_back(use); });

  for (Instruction* use : uses) {
    if (!UpdateUse(use, inst)) {
      return false;
    }
  }
  return true;
}